

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::InsertShiftedInfo
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t indent_length,GeneratedCodeInfo *target_info)

{
  int32_t *piVar1;
  GeneratedCodeInfo_Annotation *from;
  uint uVar2;
  Rep *pRVar3;
  void **ppvVar4;
  GeneratedCodeInfo_Annotation *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *this_01;
  anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *paVar8;
  long lVar9;
  
  this_01 = &(this->info_to_insert_).field_0;
  paVar8 = this_01;
  if ((undefined1  [32])((undefined1  [32])(this->info_to_insert_).field_0 & (undefined1  [32])0x1)
      != (undefined1  [32])0x0) {
    pRVar3 = internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)&this_01->_impl_);
    paVar8 = (anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)pRVar3->elements;
    if ((undefined1  [32])((undefined1  [32])*this_01 & (undefined1  [32])0x1) !=
        (undefined1  [32])0x0) {
      pRVar3 = internal::RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)&this_01->_impl_);
      this_01 = (anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)pRVar3->elements;
    }
  }
  ppvVar4 = (void **)((long)this_01 + (long)*(int *)((long)&(this->info_to_insert_).field_0 + 8) * 8
                     );
  if (paVar8 != (anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)ppvVar4) {
    lVar9 = insertion_offset + indent_length;
    uVar6 = 0;
    do {
      from = (GeneratedCodeInfo_Annotation *)
             (paVar8->_impl_).annotation_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_;
      this_00 = (GeneratedCodeInfo_Annotation *)
                internal::RepeatedPtrFieldBase::AddMessageLite
                          ((RepeatedPtrFieldBase *)&(target_info->field_0)._impl_,
                           Arena::DefaultConstruct<google::protobuf::GeneratedCodeInfo_Annotation>);
      uVar5 = (ulong)(from->field_0)._impl_.end_;
      if (uVar6 < uVar5) {
        uVar2 = 0;
        do {
          uVar7 = uVar6;
          if (insertion_content->_M_string_length - 1 <= uVar6) break;
          if ((insertion_content->_M_dataplus)._M_p[uVar6] == '\n') {
            if (uVar6 < (ulong)(long)(from->field_0)._impl_.begin_) {
              lVar9 = lVar9 + indent_length;
            }
            else {
              uVar2 = uVar2 + (int)indent_length;
            }
          }
          uVar6 = uVar6 + 1;
          uVar7 = uVar5;
        } while (uVar5 != uVar6);
        uVar5 = (ulong)uVar2;
        uVar6 = uVar7;
      }
      else {
        uVar5 = 0;
      }
      GeneratedCodeInfo_Annotation::CopyFrom(this_00,from);
      piVar1 = &(this_00->field_0)._impl_.begin_;
      *piVar1 = *piVar1 + (int)lVar9;
      lVar9 = lVar9 + uVar5;
      piVar1 = &(this_00->field_0)._impl_.end_;
      *piVar1 = *piVar1 + (int)lVar9;
      *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 6;
      paVar8 = (anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)((long)paVar8 + 8);
    } while (paVar8 != (anon_union_32_1_493b367e_for_GeneratedCodeInfo_3 *)ppvVar4);
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::InsertShiftedInfo(
    const std::string& insertion_content, size_t insertion_offset,
    size_t indent_length, google::protobuf::GeneratedCodeInfo& target_info) {
  // Keep track of how much extra data was added for indents before the
  // current annotation being inserted. `pos` and `source_annotation.begin()`
  // are offsets in `insertion_content`. `insertion_offset` is updated so that
  // it can be added to an annotation's `begin` field to reflect that
  // annotation's updated location after `insertion_content` was inserted into
  // the target file.
  size_t pos = 0;
  insertion_offset += indent_length;
  for (const auto& source_annotation : info_to_insert_.annotation()) {
    GeneratedCodeInfo::Annotation* annotation = target_info.add_annotation();
    int inner_indent = 0;
    // insertion_content is guaranteed to end in an endline. This last endline
    // has no effect on indentation.
    for (; pos < static_cast<size_t>(source_annotation.end()) &&
           pos < insertion_content.size() - 1;
         ++pos) {
      if (insertion_content[pos] == '\n') {
        if (pos >= static_cast<size_t>(source_annotation.begin())) {
          // The beginning of the annotation is at insertion_offset, but the end
          // can still move further in the target file.
          inner_indent += indent_length;
        } else {
          insertion_offset += indent_length;
        }
      }
    }
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + insertion_offset);
    insertion_offset += inner_indent;
    annotation->set_end(annotation->end() + insertion_offset);
  }
}